

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bool fmt::v8::detail::dragonbox::is_center_integer<float>
               (carrier_uint two_f,int exponent,int minus_k)

{
  int iVar1;
  bool bVar2;
  
  if (exponent < 0x28) {
    if (exponent < 7) {
      bVar2 = true;
      if (exponent < -2) {
        if (minus_k - exponent < 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
                      ,0x3b0,"");
        }
        if (two_f == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
                      ,0x3b1,"");
        }
        iVar1 = 0;
        if (two_f != 0) {
          for (; (two_f >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
          }
        }
        bVar2 = minus_k - exponent < iVar1;
      }
    }
    else {
      if (10 < minus_k) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
                    ,0x3ca,"too large exponent");
      }
      bVar2 = two_f * *(int *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                              (long)minus_k * 8) <=
              *(uint *)(divisible_by_power_of_5(unsigned_int,int)::divtest_table +
                       (long)minus_k * 8 + 4);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_center_integer(typename float_info<T>::carrier_uint two_f, int exponent,
                       int minus_k) FMT_NOEXCEPT {
  // Exponent for 5 is negative.
  if (exponent > float_info<T>::divisibility_check_by_5_threshold) return false;
  if (exponent > float_info<T>::case_fc_upper_threshold)
    return divisible_by_power_of_5(two_f, minus_k);
  // Both exponents are nonnegative.
  if (exponent >= float_info<T>::case_fc_lower_threshold) return true;
  // Exponent for 2 is negative.
  return divisible_by_power_of_2(two_f, minus_k - exponent + 1);
}